

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O0

u_char * ngx_http_time(u_char *buf,time_t t)

{
  u_char *puVar1;
  undefined1 local_50 [8];
  ngx_tm_t tm;
  time_t t_local;
  u_char *buf_local;
  
  tm.tm_zone = (char *)t;
  ngx_gmtime(t,(ngx_tm_t *)local_50);
  puVar1 = ngx_sprintf(buf,"%s, %02d %s %4d %02d:%02d:%02d GMT",week[tm.tm_mon],
                       (ulong)(uint)tm.tm_min,months[tm.tm_hour + -1],(ulong)(uint)tm.tm_mday,
                       tm.tm_sec,local_50._4_4_,local_50._0_4_);
  return puVar1;
}

Assistant:

u_char *
ngx_http_time(u_char *buf, time_t t)
{
    ngx_tm_t  tm;

    ngx_gmtime(t, &tm);

    return ngx_sprintf(buf, "%s, %02d %s %4d %02d:%02d:%02d GMT",
                       week[tm.ngx_tm_wday],
                       tm.ngx_tm_mday,
                       months[tm.ngx_tm_mon - 1],
                       tm.ngx_tm_year,
                       tm.ngx_tm_hour,
                       tm.ngx_tm_min,
                       tm.ngx_tm_sec);
}